

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O2

ktx_error_code_e
ktxTexture2_CreateFromNamedFile
          (char *filename,ktxTextureCreateFlags createFlags,ktxTexture2 **newTex)

{
  ktx_error_code_e kVar1;
  ktxTexture2 *This;
  FILE *file;
  ktxStream local_90;
  
  if (newTex == (ktxTexture2 **)0x0) {
    return KTX_INVALID_VALUE;
  }
  This = (ktxTexture2 *)malloc(0xa8);
  if (This == (ktxTexture2 *)0x0) {
    return KTX_OUT_OF_MEMORY;
  }
  if (filename == (char *)0x0) {
    kVar1 = KTX_INVALID_VALUE;
  }
  else {
    file = fopen(filename,"rb");
    if (file == (FILE *)0x0) {
      kVar1 = KTX_FILE_OPEN_FAILED;
    }
    else {
      kVar1 = ktxFileStream_construct(&local_90,(FILE *)file,true);
      if ((kVar1 == KTX_SUCCESS) &&
         (kVar1 = ktxTexture2_constructFromStream(This,&local_90,createFlags), kVar1 == KTX_SUCCESS)
         ) {
        kVar1 = KTX_SUCCESS;
        goto LAB_001f0d13;
      }
    }
  }
  free(This);
  This = (ktxTexture2 *)0x0;
LAB_001f0d13:
  *newTex = This;
  return kVar1;
}

Assistant:

KTX_error_code
ktxTexture2_CreateFromNamedFile(const char* const filename,
                                ktxTextureCreateFlags createFlags,
                                ktxTexture2** newTex)
{
    KTX_error_code result;

    if (newTex == NULL)
        return KTX_INVALID_VALUE;

    ktxTexture2* tex = (ktxTexture2*)malloc(sizeof(ktxTexture2));
    if (tex == NULL)
        return KTX_OUT_OF_MEMORY;

    result = ktxTexture2_constructFromNamedFile(tex, filename, createFlags);
    if (result == KTX_SUCCESS)
        *newTex = (ktxTexture2*)tex;
    else {
        free(tex);
        *newTex = NULL;
    }
    return result;
}